

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O1

bool __thiscall search::BSTNode::erase(BSTNode *this,int key,Record **r)

{
  int key_00;
  BSTNode *pBVar1;
  BSTNode *pBVar2;
  BSTNode *cur;
  Record *r1;
  Record *local_20;
  
  do {
    if (this->key_ == key) goto LAB_0010684f;
    this = (&this->left_)[this->key_ < key];
  } while (this != (BSTNode *)0x0);
  this = (BSTNode *)0x0;
LAB_0010684f:
  if (this == (BSTNode *)0x0) goto LAB_00106913;
  *r = this->record_;
  if (this->left_ == (BSTNode *)0x0) {
    if (this->right_ == (BSTNode *)0x0) {
      (&this->parent_->left_)[this->parent_->key_ < this->key_] = (BSTNode *)0x0;
      goto LAB_00106906;
    }
    if (this->right_ != (BSTNode *)0x0) {
      pBVar2 = this->parent_;
      (&pBVar2->left_)[pBVar2->key_ < this->key_] = this->right_;
      pBVar1 = this->right_;
      goto LAB_001068ea;
    }
  }
  else if (this->right_ == (BSTNode *)0x0) {
    pBVar2 = this->parent_;
    (&pBVar2->left_)[pBVar2->key_ < this->key_] = this->left_;
    pBVar1 = this->left_;
LAB_001068ea:
    pBVar1->parent_ = pBVar2;
LAB_00106906:
    operator_delete(this,0x28);
    goto LAB_00106913;
  }
  pBVar2 = this->right_;
  do {
    pBVar1 = pBVar2;
    pBVar2 = pBVar1->left_;
  } while (pBVar2 != (BSTNode *)0x0);
  local_20 = (Record *)0x0;
  key_00 = pBVar1->key_;
  erase(this,key_00,&local_20);
  this->key_ = key_00;
  this->record_ = local_20;
LAB_00106913:
  return this != (BSTNode *)0x0;
}

Assistant:

bool BSTNode::erase(int key, Record*& r)
    {
        BSTNode* nd = search(key);
        if (!nd)
            return false;
        r = nd->record_;
        if (!nd->left_ && !nd->right_)
        {

            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nullptr;
            else
                nd->parent_->left_ = nullptr;
            delete nd;
        }
        else if (!nd->left_ && nd->right_)
        {
            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nd->right_;
            else
                nd->parent_->left_ = nd->right_;
            nd->right_->parent_ = nd->parent_;
            delete nd;
        }
        else if (nd->left_ && !nd->right_)
        {
            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nd->left_;
            else
                nd->parent_->left_ = nd->left_;
            nd->left_->parent_ = nd->parent_;
            delete nd;
        }
        else
        {
            auto su = nd->successor();
            Record* r1 = nullptr;
            int kk = su->key_;
            nd->erase(su->key_, r1);
            nd->key_ = kk;
            nd->record_ = r1;
        }
        return true;
    }